

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue make_obj_error(JSContext *ctx,JSValue obj,int err)

{
  JSValue val;
  JSValue val_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue JVar1;
  int iVar2;
  undefined4 in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar3;
  JSValue arr;
  JSContext *in_stack_ffffffffffffff80;
  undefined8 local_70;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  
  JVar3.tag = in_RDX;
  JVar3.u.float64 = in_RSI.float64;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    JVar3 = JS_NewArray(in_stack_ffffffffffffff80);
    local_70 = JVar3.u;
    local_28 = JVar3.tag;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 == 0) {
      this_obj.tag = (int64_t)in_RSI.ptr;
      this_obj.u.ptr = in_RDI.ptr;
      val.tag._0_4_ = in_stack_ffffffffffffffb0;
      val.u.ptr = (void *)local_28;
      val.tag._4_4_ = in_ECX;
      JS_DefinePropertyValueUint32((JSContext *)local_70,this_obj,JVar3.tag._4_4_,val,(int)arr.tag);
      this_obj_00.tag = (int64_t)in_RSI.ptr;
      this_obj_00.u.ptr = in_RDI.ptr;
      val_00.tag._0_4_ = in_stack_ffffffffffffffb0;
      val_00.u.ptr = (void *)local_28;
      val_00.tag._4_4_ = in_ECX;
      JS_DefinePropertyValueUint32
                ((JSContext *)local_70,this_obj_00,JVar3.tag._4_4_,val_00,(int)arr.tag);
      local_30 = (int32_t)local_70;
      uStack_2c = local_70._4_4_;
    }
    else {
      local_30 = 0;
      local_28 = 6;
    }
  }
  else {
    local_30 = in_RSI.int32;
    uStack_2c = in_RSI._4_4_;
    local_28 = in_RDX;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue make_obj_error(JSContext *ctx,
                              JSValue obj,
                              int err)
{
    JSValue arr;
    if (JS_IsException(obj))
        return obj;
    arr = JS_NewArray(ctx);
    if (JS_IsException(arr))
        return JS_EXCEPTION;
    JS_DefinePropertyValueUint32(ctx, arr, 0, obj,
                                 JS_PROP_C_W_E);
    JS_DefinePropertyValueUint32(ctx, arr, 1, JS_NewInt32(ctx, err),
                                 JS_PROP_C_W_E);
    return arr;
}